

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O2

void mbedtls_ssl_dtls_replay_update(mbedtls_ssl_context *ssl)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = ssl_load_six_bytes(ssl->in_ctr + 2);
  if (ssl->conf->anti_replay != '\0') {
    uVar3 = ssl->in_window_top;
    uVar2 = uVar1 - uVar3;
    if (uVar1 < uVar3 || uVar2 == 0) {
      if (uVar3 - uVar1 < 0x40) {
        ssl->in_window = ssl->in_window | 1L << ((byte)(uVar3 - uVar1) & 0x3f);
      }
    }
    else {
      if (uVar2 < 0x40) {
        uVar3 = ssl->in_window << ((byte)uVar2 & 0x3f) | 1;
      }
      else {
        uVar3 = 1;
      }
      ssl->in_window = uVar3;
      ssl->in_window_top = uVar1;
    }
  }
  return;
}

Assistant:

void mbedtls_ssl_dtls_replay_update(mbedtls_ssl_context *ssl)
{
    uint64_t rec_seqnum = ssl_load_six_bytes(ssl->in_ctr + 2);

    if (ssl->conf->anti_replay == MBEDTLS_SSL_ANTI_REPLAY_DISABLED) {
        return;
    }

    if (rec_seqnum > ssl->in_window_top) {
        /* Update window_top and the contents of the window */
        uint64_t shift = rec_seqnum - ssl->in_window_top;

        if (shift >= 64) {
            ssl->in_window = 1;
        } else {
            ssl->in_window <<= shift;
            ssl->in_window |= 1;
        }

        ssl->in_window_top = rec_seqnum;
    } else {
        /* Mark that number as seen in the current window */
        uint64_t bit = ssl->in_window_top - rec_seqnum;

        if (bit < 64) { /* Always true, but be extra sure */
            ssl->in_window |= (uint64_t) 1 << bit;
        }
    }
}